

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O2

Pdr_Set_t * Txs3_ManTernarySim(Txs3_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Gia_Man_t *p_00;
  Pdr_Man_t *pPVar1;
  lit *begin;
  int *piVar2;
  Aig_Man_t *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Gia_Obj_t *pGVar8;
  sat_solver *s;
  Vec_Int_t *pVVar9;
  Aig_Obj_t *pAVar10;
  void **ppvVar11;
  Pdr_Set_t *pCube_00;
  Vec_Int_t *pVVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  int i;
  long lVar16;
  ulong uVar17;
  
  p->vCoObjs->nSize = 0;
  if (pCube == (Pdr_Set_t *)0x0) {
    pGVar8 = Gia_ManCo(p->pGia,p->pMan->iOutCur);
    pVVar9 = p->vCoObjs;
    iVar5 = Gia_ObjId(p->pGia,pGVar8);
    Vec_IntPush(pVVar9,iVar5);
  }
  else {
    for (lVar16 = 0; lVar16 < pCube->nLits; lVar16 = lVar16 + 1) {
      if (*(int *)(&pCube->field_0x14 + lVar16 * 4) != -1) {
        p_00 = p->pGia;
        iVar5 = p_00->vCos->nSize;
        iVar6 = p_00->nRegs;
        iVar4 = Abc_Lit2Var(*(int *)(&pCube->field_0x14 + lVar16 * 4));
        pGVar8 = Gia_ManCo(p_00,(iVar5 - iVar6) + iVar4);
        pVVar9 = p->vCoObjs;
        iVar5 = Gia_ObjId(p->pGia,pGVar8);
        Vec_IntPush(pVVar9,iVar5);
      }
    }
  }
  Txs3_ManCollectCone(p,0);
  Pdr_ManCollectValues(p->pMan,k,p->vCiObjs,p->vCiVals);
  Pdr_ManCollectValues(p->pMan,k,p->vCoObjs,p->vCoVals);
  s = Pdr_ManFetchSolver(p->pMan,k);
  iVar5 = Pdr_ManFreeVar(p->pMan,k);
  iVar5 = Abc_Var2Lit(iVar5,0);
  pPVar1 = p->pMan;
  if (pCube == (Pdr_Set_t *)0x0) {
    pVVar9 = pPVar1->vLits;
    pAVar10 = (Aig_Obj_t *)Vec_PtrEntry(pPVar1->pAig->vCos,pPVar1->iOutCur);
    iVar6 = Pdr_ObjSatVar(pPVar1,k,2,pAVar10);
    iVar6 = Abc_Var2Lit(iVar6,1);
    Vec_IntGrow(pVVar9,1);
    *pVVar9->pArray = iVar6;
    pVVar9->nSize = 1;
  }
  else {
    pVVar9 = Pdr_ManCubeToLits(pPVar1,k,pCube,1,1);
  }
  Vec_IntPush(pVVar9,iVar5);
  iVar6 = sat_solver_addclause(s,pVVar9->pArray,pVVar9->pArray + pVVar9->nSize);
  if (iVar6 == 1) {
    if (s->qtail != s->qhead) {
      iVar6 = sat_solver_simplify(s);
      if (iVar6 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                      ,0x102,"void sat_solver_compress(sat_solver *)");
      }
    }
    pVVar9 = p->vTemp;
    pVVar9->nSize = 0;
    iVar6 = Abc_LitNot(iVar5);
    Vec_IntPush(pVVar9,iVar6);
    iVar6 = 0;
    while( true ) {
      if (p->vCiObjs->nSize <= iVar6) {
        begin = p->vTemp->pArray;
        uVar15 = 0;
        iVar6 = sat_solver_solve(s,begin,begin + p->vTemp->nSize,0,0,0,0);
        if (iVar6 != -1) {
          __assert_fail("RetValue == l_False",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                        ,0x126,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
        }
        piVar2 = (s->conf_final).ptr;
        uVar14 = (s->conf_final).size;
        p->vTemp->nSize = 0;
        uVar17 = (ulong)uVar14;
        if ((int)uVar14 < 1) {
          uVar17 = uVar15;
        }
        for (; pVVar9 = p->vTemp, uVar17 != uVar15; uVar15 = uVar15 + 1) {
          iVar6 = Abc_LitNot(piVar2[uVar15]);
          Vec_IntPush(pVVar9,iVar6);
        }
        Vec_IntSelectSort(pVVar9->pArray,pVVar9->nSize);
        p->vPiLits->nSize = 0;
        p->vFfLits->nSize = 0;
        pPVar1 = p->pMan;
        iVar6 = (pPVar1->vVar2Ids).nSize;
        if (iVar6 <= k) {
          iVar13 = k + 1;
          iVar4 = (pPVar1->vVar2Ids).nCap;
          iVar7 = iVar13;
          if (((iVar4 * 2 <= k) || (iVar7 = iVar4 * 2, iVar4 <= k)) && (iVar4 < iVar7)) {
            ppvVar11 = (pPVar1->vVar2Ids).pArray;
            if (ppvVar11 == (void **)0x0) {
              ppvVar11 = (void **)malloc((long)iVar7 << 3);
            }
            else {
              ppvVar11 = (void **)realloc(ppvVar11,(long)iVar7 << 3);
              iVar6 = (pPVar1->vVar2Ids).nSize;
            }
            (pPVar1->vVar2Ids).pArray = ppvVar11;
            (pPVar1->vVar2Ids).nCap = iVar7;
          }
          for (lVar16 = (long)iVar6; lVar16 < iVar13; lVar16 = lVar16 + 1) {
            (pPVar1->vVar2Ids).pArray[lVar16] = (void *)0x0;
          }
          (pPVar1->vVar2Ids).nSize = iVar13;
        }
        pVVar9 = (Vec_Int_t *)Vec_PtrEntry(&pPVar1->vVar2Ids,k);
        iVar6 = 0;
        while( true ) {
          iVar4 = p->vTemp->nSize;
          if (iVar4 <= iVar6) break;
          iVar4 = Vec_IntEntry(p->vTemp,iVar6);
          iVar7 = Abc_LitNot(iVar5);
          if (iVar4 != iVar7) {
            iVar7 = Abc_Lit2Var(iVar4);
            iVar7 = Vec_IntEntry(pVVar9,iVar7);
            pAVar10 = Aig_ManObj(p->pMan->pAig,iVar7);
            if ((*(uint *)&pAVar10->field_0x18 & 7) != 2) {
              __assert_fail("Aig_ObjIsCi(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                            ,0x13e,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
            }
            pAVar3 = p->pMan->pAig;
            iVar7 = Aig_ObjCioId(pAVar10);
            if (iVar7 < pAVar3->nTruePis) {
              pVVar12 = p->vPiLits;
              iVar7 = Aig_ObjCioId(pAVar10);
            }
            else {
              pVVar12 = p->vFfLits;
              iVar7 = Aig_ObjCioId(pAVar10);
              iVar7 = iVar7 - p->pMan->pAig->nTruePis;
            }
            iVar4 = Abc_LitIsCompl(iVar4);
            iVar4 = Abc_Var2Lit(iVar7,iVar4);
            Vec_IntPush(pVVar12,iVar4);
          }
          iVar6 = iVar6 + 1;
        }
        pVVar9 = p->vPiLits;
        pVVar12 = p->vFfLits;
        iVar5 = pVVar12->nSize;
        if (iVar4 != pVVar9->nSize + iVar5 + 1) {
          __assert_fail("Vec_IntSize(p->vTemp) == Vec_IntSize(p->vPiLits) + Vec_IntSize(p->vFfLits) + 1"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                        ,0x145,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
        }
        if ((p->pMan->pPars->fUseAbs != 0) && (p->pMan->vAbsFlops != (Vec_Int_t *)0x0)) {
          uVar14 = 0;
          for (iVar6 = 0; iVar6 < iVar5; iVar6 = iVar6 + 1) {
            iVar5 = Vec_IntEntry(pVVar12,iVar6);
            pVVar9 = p->pMan->vAbsFlops;
            iVar4 = Abc_Lit2Var(iVar5);
            iVar4 = Vec_IntEntry(pVVar9,iVar4);
            if (iVar4 == 0) {
              Vec_IntPush(p->vPiLits,iVar5 + p->pMan->pAig->nTruePis * 2);
              pVVar12 = p->vFfLits;
            }
            else {
              if (((int)uVar14 < 0) || (pVVar12 = p->vFfLits, pVVar12->nSize <= (int)uVar14)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                              ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar15 = (ulong)uVar14;
              uVar14 = uVar14 + 1;
              pVVar12->pArray[uVar15] = iVar5;
            }
            iVar5 = pVVar12->nSize;
          }
          if (iVar5 < (int)uVar14) {
            __assert_fail("p->nSize >= nSizeNew",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
          }
          pVVar12->nSize = uVar14;
          pVVar9 = p->vPiLits;
        }
        pCube_00 = Pdr_SetCreate(pVVar12,pVVar9);
        if (k != 0) {
          iVar5 = Pdr_SetIsInit(pCube_00,-1);
          if (iVar5 != 0) {
            __assert_fail("k == 0 || !Pdr_SetIsInit(pRes, -1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                          ,0x160,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
          }
        }
        return pCube_00;
      }
      iVar4 = Vec_IntEntry(p->vCiObjs,iVar6);
      iVar7 = Vec_IntEntry(p->vCiVals,iVar6);
      pAVar10 = Aig_ManObj(p->pMan->pAig,iVar4);
      iVar4 = Pdr_ObjSatVar(p->pMan,k,3,pAVar10);
      if (iVar4 < 0) {
        __assert_fail("iVar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                      ,0x104,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
      }
      if ((*(uint *)&pAVar10->field_0x18 & 7) != 2) break;
      pVVar9 = p->vTemp;
      iVar4 = Abc_Var2Lit(iVar4,(uint)(iVar7 == 0));
      Vec_IntPush(pVVar9,iVar4);
      iVar6 = iVar6 + 1;
    }
    __assert_fail("Aig_ObjIsCi(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                  ,0x105,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
  }
  __assert_fail("RetValue == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim3.c"
                ,0xf9,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
}

Assistant:

Pdr_Set_t * Txs3_ManTernarySim( Txs3_Man_t * p, int k, Pdr_Set_t * pCube )
{
//    int fTryNew = 1;
//    int fUseLit = 1;
    int fVerbose = 0;
    sat_solver * pSat;
    Pdr_Set_t * pRes;
    Gia_Obj_t * pObj;
    Vec_Int_t * vVar2Ids, * vLits;
    int i, Lit, LitAux, Var, Value, RetValue, nCoreLits, * pCoreLits;//, nLits;
//    if ( k == 0 )
//        fVerbose = 1;
    // collect CO objects
    Vec_IntClear( p->vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
        pObj = Gia_ManCo(p->pGia, p->pMan->iOutCur);
        Vec_IntPush( p->vCoObjs, Gia_ObjId(p->pGia, pObj) );
    }
    else // the target is the cube
    {
        int i;
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Gia_ManCo(p->pGia, Gia_ManPoNum(p->pGia) + Abc_Lit2Var(pCube->Lits[i]));
            Vec_IntPush( p->vCoObjs, Gia_ObjId(p->pGia, pObj) );
        }
    }
if ( 0 )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Gia_ManRegNum(p->pGia), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Txs3_ManCollectCone( p, fVerbose );
    // collect values
    Pdr_ManCollectValues( p->pMan, k, p->vCiObjs, p->vCiVals );
    Pdr_ManCollectValues( p->pMan, k, p->vCoObjs, p->vCoVals );

    // read solver
    pSat = Pdr_ManFetchSolver( p->pMan, k );
    LitAux = Abc_Var2Lit( Pdr_ManFreeVar(p->pMan, k), 0 );
    // add the clause (complemented cube) in terms of next state variables
    if ( pCube == NULL ) // the target is the property output
    {
        vLits = p->pMan->vLits;
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p->pMan, k, 2, Aig_ManCo(p->pMan->pAig, p->pMan->iOutCur)), 1 ); // neg literal (property holds)
        Vec_IntFill( vLits, 1, Lit );
    }
    else
        vLits = Pdr_ManCubeToLits( p->pMan, k, pCube, 1, 1 );
    // add activation literal
    Vec_IntPush( vLits, LitAux );
    RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
    assert( RetValue == 1 );
    sat_solver_compress( pSat );

    // collect assumptions 
    Vec_IntClear( p->vTemp );
    Vec_IntPush( p->vTemp, Abc_LitNot(LitAux) );
    // iterate through the values of the CI variables
    Vec_IntForEachEntryTwo( p->vCiObjs, p->vCiVals, Var, Value, i )
    {
        Aig_Obj_t * pObj = Aig_ManObj( p->pMan->pAig, Var );
//        iVar = Pdr_ObjSatVar( p->pMan, k, fNext ? 2 - lit_sign(pCube->Lits[i]) : 3, pObj ); assert( iVar >= 0 );
        int iVar = Pdr_ObjSatVar( p->pMan, k, 3, pObj ); assert( iVar >= 0 );
        assert( Aig_ObjIsCi(pObj) );
        Vec_IntPush( p->vTemp, Abc_Var2Lit(iVar, !Value) );
    }
    if ( fVerbose )
    {
        printf( "Clause with %d lits on lev %d\n", pCube ? pCube->nLits : 0, k );
        Vec_IntPrint( p->vTemp );
    }

/*
    // solve with assumptions
//printf( "%d -> ", Vec_IntSize(p->vTemp) );
{
abctime clk = Abc_Clock();
// assume all except flops
    Vec_IntForEachEntryStop( p->vTemp, Lit, i, p->nPiLits + 1 )
        if ( !sat_solver_push(pSat, Lit) )
        {
            assert( 0 );
        }
    nLits = sat_solver_minimize_assumptions( pSat, Vec_IntArray(p->vTemp) + p->nPiLits + 1, Vec_IntSize(p->vTemp) - p->nPiLits - 1, p->pMan->pPars->nConfLimit );
    Vec_IntShrink( p->vTemp, p->nPiLits + 1 + nLits );

p->pMan->tAbs += Abc_Clock() - clk;
    for ( i = 0; i <= p->nPiLits; i++ )
        sat_solver_pop(pSat);
}
//printf( "%d    ", nLits );
*/


    //check one last time
    RetValue = sat_solver_solve( pSat, Vec_IntArray(p->vTemp), Vec_IntLimit(p->vTemp), 0, 0, 0, 0 );
    assert( RetValue == l_False );

    // use analyze final
    nCoreLits = sat_solver_final(pSat, &pCoreLits);
    //assert( Vec_IntSize(p->vTemp) <= nCoreLits );

    Vec_IntClear( p->vTemp );
    for ( i = 0; i < nCoreLits; i++ )
        Vec_IntPush( p->vTemp, Abc_LitNot(pCoreLits[i]) );
    Vec_IntSelectSort( Vec_IntArray(p->vTemp), Vec_IntSize(p->vTemp) );

    if ( fVerbose )
        Vec_IntPrint( p->vTemp );

    // collect the resulting sets
    Vec_IntClear( p->vPiLits );
    Vec_IntClear( p->vFfLits );
    vVar2Ids = (Vec_Int_t *)Vec_PtrGetEntry( &p->pMan->vVar2Ids, k );
    Vec_IntForEachEntry( p->vTemp, Lit, i )
    {
        if ( Lit != Abc_LitNot(LitAux) )
        {
            int Id = Vec_IntEntry( vVar2Ids, Abc_Lit2Var(Lit) );
            Aig_Obj_t * pObj = Aig_ManObj( p->pMan->pAig, Id );
            assert( Aig_ObjIsCi(pObj) );
            if ( Saig_ObjIsPi(p->pMan->pAig, pObj) )
                Vec_IntPush( p->vPiLits, Abc_Var2Lit(Aig_ObjCioId(pObj), Abc_LitIsCompl(Lit)) );
            else
                Vec_IntPush( p->vFfLits, Abc_Var2Lit(Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pMan->pAig), Abc_LitIsCompl(Lit)) );
        }
    }
    assert( Vec_IntSize(p->vTemp) == Vec_IntSize(p->vPiLits) + Vec_IntSize(p->vFfLits) + 1 );

    // move abstracted literals from flops to inputs
    if ( p->pMan->pPars->fUseAbs && p->pMan->vAbsFlops )
    {
        int i, iLit, k = 0;
        Vec_IntForEachEntry( p->vFfLits, iLit, i )
        {
            if ( Vec_IntEntry(p->pMan->vAbsFlops, Abc_Lit2Var(iLit)) ) // used flop
                Vec_IntWriteEntry( p->vFfLits, k++, iLit );
            else
                Vec_IntPush( p->vPiLits, 2*Saig_ManPiNum(p->pMan->pAig) + iLit );
        }
        Vec_IntShrink( p->vFfLits, k );
    }

    if ( fVerbose )
        Vec_IntPrint( p->vPiLits );
    if ( fVerbose )
        Vec_IntPrint( p->vFfLits );
    if ( fVerbose )
        printf( "\n" );

    // derive the final set
    pRes = Pdr_SetCreate( p->vFfLits, p->vPiLits );
    //ZH: Disabled assertion because this invariant doesn't hold with down
    //because of the join operation which can bring in initial states
    assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}